

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

sample * __thiscall
Catch::Benchmark::Detail::(anonymous_namespace)::
resample<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,double(*)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
          (sample *__return_storage_ptr__,_anonymous_namespace_ *this,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *rng,uint resamples,const_iterator first,const_iterator last,
          _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  code *pcVar1;
  result_type_conflict __n;
  reference __x;
  iterator __first;
  iterator __last;
  undefined4 in_register_0000000c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b8;
  undefined8 local_b0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a8;
  undefined8 local_a0;
  value_type_conflict4 local_98;
  double estimate;
  size_t s;
  size_t i;
  vector<double,_std::allocator<double>_> resampled;
  undefined1 local_50 [8];
  uniform_int_distribution<unsigned_long> dist;
  size_t n;
  _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
  **estimator_local;
  uint resamples_local;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *rng_local;
  const_iterator last_local;
  const_iterator first_local;
  sample *out;
  
  last_local._M_current = (double *)CONCAT44(in_register_0000000c,resamples);
  rng_local = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *)first._M_current;
  dist._M_param._M_b =
       __gnu_cxx::operator-
                 ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                   *)&rng_local,&last_local);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)local_50,0,dist._M_param._M_b - 1);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,(ulong)rng & 0xffffffff);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&i,dist._M_param._M_b);
  for (s = 0; s < ((ulong)rng & 0xffffffff); s = s + 1) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)&i);
    for (estimate = 0.0; (ulong)estimate < dist._M_param._M_b;
        estimate = (double)((long)estimate + 1)) {
      __n = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_50,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)this);
      __x = __gnu_cxx::
            __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator[](&last_local,__n);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&i,__x);
    }
    pcVar1 = (code *)*last._M_current;
    local_a8._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)&i);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_a0,&local_a8);
    local_b8._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)&i);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_b0,&local_b8);
    local_98 = (value_type_conflict4)(*pcVar1)(local_a0,local_b0);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_98);
  }
  __first = std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  __last = std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

static sample
                resample( URng& rng,
                          unsigned int resamples,
                          std::vector<double>::const_iterator first,
                          std::vector<double>::const_iterator last,
                          Estimator& estimator ) {
                    auto n = static_cast<size_t>( last - first );
                    std::uniform_int_distribution<decltype( n )> dist( 0,
                                                                       n - 1 );

                    sample out;
                    out.reserve( resamples );
                    // We allocate the vector outside the loop to avoid realloc
                    // per resample
                    std::vector<double> resampled;
                    resampled.reserve( n );
                    for ( size_t i = 0; i < resamples; ++i ) {
                        resampled.clear();
                        for ( size_t s = 0; s < n; ++s ) {
                            resampled.push_back(
                                first[static_cast<std::ptrdiff_t>(
                                    dist( rng ) )] );
                        }
                        const auto estimate =
                            estimator( resampled.begin(), resampled.end() );
                        out.push_back( estimate );
                    }
                    std::sort( out.begin(), out.end() );
                    return out;
                }